

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator> *
__thiscall
QMultiHash<int,_QString>::equal_range_impl<int>
          (pair<QMultiHash<int,_QString>::const_iterator,_QMultiHash<int,_QString>::const_iterator>
           *__return_storage_ptr__,QMultiHash<int,_QString> *this,int *key)

{
  Data<QHashPrivate::MultiNode<int,_QString>_> *this_00;
  Data *pDVar1;
  Span *pSVar2;
  ulong uVar3;
  Data *pDVar4;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  Bucket BVar8;
  
  this_00 = this->d;
  if (this_00 != (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0) {
    uVar3 = (long)*key ^ this_00->seed;
    uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
    uVar3 = (uVar3 >> 0x20 ^ uVar3) * -0x2917014799a6026d;
    BVar8 = QHashPrivate::Data<QHashPrivate::MultiNode<int,_QString>_>::findBucketWithHash<int>
                      (this_00,key,uVar3 >> 0x20 ^ uVar3);
    if ((BVar8.span)->offsets[BVar8.index] != 0xff) {
      pDVar1 = this->d;
      pSVar2 = pDVar1->spans;
      uVar6 = ((ulong)((long)BVar8.span - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
      uVar3 = uVar6;
      do {
        if (pDVar1->numBuckets - 1 == uVar3) {
          uVar3 = 0;
          pDVar4 = (Data *)0x0;
          break;
        }
        uVar3 = uVar3 + 1;
        pDVar4 = pDVar1;
      } while (pSVar2[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      if (pDVar1 == (Data *)0x0) {
        puVar5 = (uchar *)0x0;
      }
      else {
        puVar5 = pSVar2[uVar6 >> 7].entries[pSVar2[uVar6 >> 7].offsets[(uint)BVar8.index & 0x7f]].
                 storage.data + 8;
      }
      if (pDVar4 == (Data *)0x0) {
        puVar7 = (uchar *)0x0;
      }
      else {
        puVar7 = pDVar4->spans[uVar3 >> 7].entries
                 [pDVar4->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data + 8;
      }
      (__return_storage_ptr__->first).i.d = pDVar1;
      (__return_storage_ptr__->first).i.bucket = uVar6;
      (__return_storage_ptr__->first).e = (Chain **)puVar5;
      (__return_storage_ptr__->second).i.d = pDVar4;
      (__return_storage_ptr__->second).i.bucket = uVar3;
      (__return_storage_ptr__->second).e = (Chain **)puVar7;
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->first).i.d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0;
  (__return_storage_ptr__->first).i.bucket = 0;
  (__return_storage_ptr__->first).e = (Chain **)0x0;
  (__return_storage_ptr__->second).i.d = (Data<QHashPrivate::MultiNode<int,_QString>_> *)0x0;
  (__return_storage_ptr__->second).i.bucket = 0;
  (__return_storage_ptr__->second).e = (Chain **)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::pair<const_iterator, const_iterator> equal_range_impl(const K &key) const noexcept
    {
        if (!d)
            return {end(), end()};

        auto bucket = d->findBucket(key);
        if (bucket.isUnused())
            return {end(), end()};
        auto it = bucket.toIterator(d);
        auto end = it;
        ++end;
        return {const_iterator(it), const_iterator(end)};
    }